

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveArea.cpp
# Opt level: O0

void __thiscall CDirectiveArea::writeTempData(CDirectiveArea *this,TempData *tempData)

{
  string *__return_storage_ptr__;
  int64_t iVar1;
  long lVar2;
  long lVar3;
  char **ppcVar4;
  char *pcVar5;
  bool bVar6;
  pointer pCVar7;
  int8_t *in_R8;
  char *in_R9;
  string local_120;
  string local_100;
  long local_e0;
  undefined1 local_d8 [8];
  string fillString;
  int64_t local_98;
  int64_t subAreaUsage;
  string local_70;
  string local_40;
  char *local_20;
  char *directiveType;
  TempData *tempData_local;
  CDirectiveArea *this_local;
  
  local_20 = ".area";
  if (((this->super_CAssemblerCommand).field_0x14 & 1) != 0) {
    local_20 = ".region";
  }
  local_20 = local_20 + 1;
  directiveType = (char *)tempData;
  tempData_local = (TempData *)this;
  bVar6 = Expression::isLoaded(&this->positionExpression);
  pcVar5 = directiveType;
  if (bVar6) {
    iVar1 = this->position;
    tinyformat::format<long>(&local_40,".org 0x%08llX",&this->position);
    TempData::writeLine((TempData *)pcVar5,iVar1,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  if ((((this->super_CAssemblerCommand).field_0x14 & 1) == 0) ||
     (bVar6 = Expression::isLoaded(&this->fillExpression), pcVar5 = directiveType, !bVar6)) {
    pcVar5 = directiveType;
    iVar1 = this->position;
    tinyformat::format<char_const*,long>
              ((string *)&subAreaUsage,(tinyformat *)".%S 0x%08X",(char *)&local_20,
               (char **)&this->areaSize,(long *)in_R8);
    TempData::writeLine((TempData *)pcVar5,iVar1,(string *)&subAreaUsage);
    std::__cxx11::string::~string((string *)&subAreaUsage);
  }
  else {
    iVar1 = this->position;
    in_R8 = &this->fillValue;
    tinyformat::format<char_const*,long,signed_char>
              (&local_70,(tinyformat *)".%S 0x%08X,0x%02x",(char *)&local_20,
               (char **)&this->areaSize,(long *)in_R8,in_R9);
    TempData::writeLine((TempData *)pcVar5,iVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
  }
  bVar6 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->content);
  if (bVar6) {
    pCVar7 = std::unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>::operator->
                       (&this->content);
    CAssemblerCommand::applyFileInfo(pCVar7);
    pCVar7 = std::unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>::operator->
                       (&this->content);
    (*pCVar7->_vptr_CAssemblerCommand[4])(pCVar7,directiveType);
  }
  bVar6 = Expression::isLoaded(&this->fillExpression);
  pcVar5 = directiveType;
  if ((bVar6) && (((this->super_CAssemblerCommand).field_0x14 & 1) == 0)) {
    local_98 = Allocations::getSubAreaUsage(this->fileID,this->position);
    pcVar5 = directiveType;
    if (local_98 != 0) {
      lVar3 = this->position;
      lVar2 = this->contentSize;
      __return_storage_ptr__ = (string *)((long)&fillString.field_2 + 8);
      tinyformat::format<long>(__return_storage_ptr__,".skip 0x%08llX",&local_98);
      TempData::writeLine((TempData *)pcVar5,lVar3 + lVar2,__return_storage_ptr__);
      std::__cxx11::string::~string((string *)(fillString.field_2._M_local_buf + 8));
    }
    local_e0 = (this->areaSize - this->contentSize) - local_98;
    tinyformat::format<long,signed_char>
              ((string *)local_d8,(tinyformat *)".fill 0x%08X,0x%02X",(char *)&local_e0,
               (long *)&this->fillValue,in_R8);
    TempData::writeLine((TempData *)directiveType,this->position + this->contentSize + local_98,
                        (string *)local_d8);
    pcVar5 = directiveType;
    lVar3 = this->position;
    ppcVar4 = (char **)this->areaSize;
    tinyformat::format<char_const*>(&local_100,(tinyformat *)".end%S",(char *)&local_20,ppcVar4);
    TempData::writeLine((TempData *)pcVar5,lVar3 + (long)ppcVar4,&local_100);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)local_d8);
  }
  else {
    lVar3 = this->position;
    ppcVar4 = (char **)this->contentSize;
    tinyformat::format<char_const*>(&local_120,(tinyformat *)".end%S",(char *)&local_20,ppcVar4);
    TempData::writeLine((TempData *)pcVar5,lVar3 + (long)ppcVar4,&local_120);
    std::__cxx11::string::~string((string *)&local_120);
  }
  return;
}

Assistant:

void CDirectiveArea::writeTempData(TempData& tempData) const
{
	const char *directiveType = shared ? "region" : "area";
	if (positionExpression.isLoaded())
		tempData.writeLine(position, tfm::format(".org 0x%08llX", position));
	if (shared && fillExpression.isLoaded())
		tempData.writeLine(position,tfm::format(".%S 0x%08X,0x%02x",directiveType,areaSize,fillValue));
	else
		tempData.writeLine(position,tfm::format(".%S 0x%08X",directiveType,areaSize));
	if (content)
	{
		content->applyFileInfo();
		content->writeTempData(tempData);
	}

	if (fillExpression.isLoaded() && !shared)
	{
		int64_t subAreaUsage = Allocations::getSubAreaUsage(fileID, position);
		if (subAreaUsage != 0)
			tempData.writeLine(position+contentSize, tfm::format(".skip 0x%08llX",subAreaUsage));

		std::string fillString = tfm::format(".fill 0x%08X,0x%02X",areaSize-contentSize-subAreaUsage,fillValue);
		tempData.writeLine(position+contentSize+subAreaUsage,fillString);
		tempData.writeLine(position+areaSize,tfm::format(".end%S",directiveType));
	} else {
		tempData.writeLine(position+contentSize,tfm::format(".end%S",directiveType));
	}
}